

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestSuite::AddTestInfo(TestSuite *this,TestInfo *test_info)

{
  size_type sVar1;
  value_type_conflict2 local_1c;
  TestInfo *local_18;
  TestInfo *test_info_local;
  TestSuite *this_local;
  
  local_18 = test_info;
  test_info_local = (TestInfo *)this;
  std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::push_back
            (&this->test_info_list_,&local_18);
  sVar1 = std::vector<int,_std::allocator<int>_>::size(&this->test_indices_);
  local_1c = (value_type_conflict2)sVar1;
  std::vector<int,_std::allocator<int>_>::push_back(&this->test_indices_,&local_1c);
  return;
}

Assistant:

void TestSuite::AddTestInfo(TestInfo* test_info) {
  test_info_list_.push_back(test_info);
  test_indices_.push_back(static_cast<int>(test_indices_.size()));
}